

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation.cpp
# Opt level: O1

string * __thiscall
duckdb::JoinRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,JoinRelation *this,idx_t depth)

{
  size_type *psVar1;
  undefined8 uVar2;
  char *pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  pointer pPVar6;
  Relation *pRVar7;
  ulong *puVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string str;
  allocator local_f1;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_50,(Relation *)depth,depth);
  pcVar3 = EnumUtil::ToChars<duckdb::JoinRefType>(this->join_ref_type);
  ::std::__cxx11::string::string((string *)&local_90,pcVar3,(allocator *)&local_b0);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1e3d557);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_60 = *puVar8;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar8;
    local_70 = (ulong *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_70);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_c0 = *puVar8;
    uStack_b8 = puVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar8;
    local_d0 = (ulong *)*puVar5;
  }
  local_c8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  pcVar3 = EnumUtil::ToChars<duckdb::JoinType>(this->join_type);
  ::std::__cxx11::string::string((string *)&local_b0,pcVar3,&local_f1);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < (ulong)(local_a8 + local_c8)) {
    uVar9 = 0xf;
    if (local_b0 != local_a0) {
      uVar9 = local_a0[0];
    }
    if (uVar9 < (ulong)(local_a8 + local_c8)) goto LAB_0163e159;
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_0163e159:
    puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
  }
  local_f0 = &local_e0;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e0 = *puVar8;
    uStack_d8 = puVar5[3];
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*puVar5;
  }
  local_e8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[7])(&local_d0);
    puVar5 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1f09bf5)
    ;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_e0 = *puVar8;
      uStack_d8 = puVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar8;
      local_f0 = (ulong *)*puVar5;
    }
    local_e8 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
  }
  local_70 = &local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  ::std::__cxx11::string::append((char *)&local_70);
  pRVar7 = shared_ptr<duckdb::Relation,_true>::operator->(&this->left);
  (*pRVar7->_vptr_Relation[6])(&local_90,pRVar7,depth + 1);
  uVar9 = 0xf;
  if (local_70 != &local_60) {
    uVar9 = local_60;
  }
  if (uVar9 < (ulong)(local_88 + local_68)) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if (uVar9 < (ulong)(local_88 + local_68)) goto LAB_0163e38b;
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0163e38b:
    puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_c0 = *puVar8;
    uStack_b8 = puVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar8;
    local_d0 = (ulong *)*puVar5;
  }
  local_c8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_d0);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e0 = *puVar8;
    uStack_d8 = puVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*puVar5;
  }
  local_e8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  pRVar7 = shared_ptr<duckdb::Relation,_true>::operator->(&this->right);
  (*pRVar7->_vptr_Relation[6])(&local_b0,pRVar7,depth + 1);
  uVar9 = 0xf;
  if (local_f0 != &local_e0) {
    uVar9 = local_e0;
  }
  if (uVar9 < (ulong)(local_a8 + local_e8)) {
    uVar9 = 0xf;
    if (local_b0 != local_a0) {
      uVar9 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_e8) <= uVar9) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0163e4c4;
    }
  }
  puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0);
LAB_0163e4c4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar2 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string JoinRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth);
	str += "Join " + EnumUtil::ToString(join_ref_type) + " " + EnumUtil::ToString(join_type);
	if (condition) {
		str += " " + condition->GetName();
	}

	return str + "\n" + left->ToString(depth + 1) + "\n" + right->ToString(depth + 1);
}